

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

pair<const_char_*,_int> google::protobuf::internal::ReadSizeFallback(char *p,uint32_t res)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  pair<const_char_*,_int> pVar9;
  
  uVar7 = (ulong)(((uint)(byte)p[1] * 0x80 + res) - 0x80);
  if (p[1] < '\0') {
    bVar5 = 0xe;
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      if (uVar3 == 2) {
        pcVar2 = (char *)0x3;
        bVar8 = true;
        goto LAB_00229454;
      }
      uVar7 = (ulong)((int)uVar7 + ((byte)p[uVar3 + 2] - 1 << (bVar5 & 0x1f)));
      bVar5 = bVar5 + 7;
      uVar1 = uVar3 + 1;
    } while (p[uVar3 + 2] < '\0');
    bVar8 = 2 < uVar3 + 1;
    lVar4 = uVar3 + 2;
  }
  else {
    lVar4 = 1;
    bVar8 = false;
  }
  pcVar2 = p + lVar4 + 1;
LAB_00229454:
  if (bVar8) {
    if (7 < (byte)p[4]) {
      return (pair<const_char_*,_int>)ZEXT816(0);
    }
    uVar6 = (int)uVar7 + (uint)(byte)p[4] * 0x10000000 + 0xf0000000;
    pcVar2 = (char *)0x0;
    if (uVar6 < 0x7ffffff0) {
      pcVar2 = p + 5;
    }
    uVar7 = (ulong)uVar6;
    if (uVar6 >= 0x7ffffff0) {
      uVar7 = 0;
    }
  }
  pVar9._8_8_ = uVar7;
  pVar9.first = pcVar2;
  return pVar9;
}

Assistant:

std::pair<const char*, int32_t> ReadSizeFallback(const char* p, uint32_t res) {
  for (std::uint32_t i = 1; i < 4; i++) {
    uint32_t byte = static_cast<uint8_t>(p[i]);
    res += (byte - 1) << (7 * i);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  std::uint32_t byte = static_cast<uint8_t>(p[4]);
  if (PROTOBUF_PREDICT_FALSE(byte >= 8)) return {nullptr, 0};  // size >= 2gb
  res += (byte - 1) << 28;
  // Protect against sign integer overflow in PushLimit. Limits are relative
  // to buffer ends and ptr could potential be kSlopBytes beyond a buffer end.
  // To protect against overflow we reject limits absurdly close to INT_MAX.
  if (PROTOBUF_PREDICT_FALSE(res > INT_MAX - ParseContext::kSlopBytes)) {
    return {nullptr, 0};
  }
  return {p + 5, res};
}